

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O3

bool __thiscall DOMLSParserHandler::handleError(DOMLSParserHandler *this,DOMError *error)

{
  int iVar1;
  wchar16 *pwVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  char *local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error occurred in DOMBuilder!  Message:  ",0x29);
  pwVar2 = (wchar16 *)(**(code **)(*(long *)error + 0x18))(error);
  __s = (char *)xercesc_4_0::XMLString::transcode
                          (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_28 = __s;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b250);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," of severity ",0xd);
  iVar1 = (**(code **)(*(long *)error + 0x10))(error);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  xercesc_4_0::XMLString::release(&local_28,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return true;
}

Assistant:

bool handleError(const DOMError &error)
    {
        char *message = 0;
        std::cerr << "Error occurred in DOMBuilder!  Message:  " <<
            (message = XMLString::transcode(error.getMessage())) << " of severity " << error.getSeverity() << "." << std::endl;
        XMLString::release(&message);
        return true;
    }